

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O0

CTcToken * __thiscall CTcPrsGramNodeCat::get_next_token(CTcPrsGramNodeCat *this)

{
  long in_RDI;
  undefined8 local_18;
  
  *(undefined8 *)(in_RDI + 0x50) = *(undefined8 *)(*(long *)(in_RDI + 0x50) + 0x38);
  if (*(long *)(in_RDI + 0x50) == 0) {
    local_18 = (CTcToken *)0x0;
  }
  else {
    local_18 = (CTcToken *)(**(code **)(**(long **)(in_RDI + 0x50) + 0x38))();
  }
  return local_18;
}

Assistant:

const CTcToken *get_next_token()
    {
        /* advance to the next subitem */
        cur_sub_ = cur_sub_->next_;
        
        /* 
         *   If there's anything left, return it; otherwise, return null.
         *   During final token expansion, a 'cat' node never has anything
         *   but tokens beneath it, since we move all the 'or' nodes to a
         *   single 'or' at the top of the tree and flatten out the 'cat'
         *   nodes to a single level under that; so, we can simply return
         *   the token directly from the next underlying node.  
         */
        return (cur_sub_ != 0 ? cur_sub_->get_tok() : 0);
    }